

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O2

_Bool upb_MiniTable_NextOneofField(upb_MiniTable *m,upb_MiniTableField **f)

{
  ushort uVar1;
  upb_MiniTableField *puVar2;
  upb_MiniTableField *puVar3;
  upb_MiniTableField *puVar4;
  upb_MiniTableField *puVar5;
  
  uVar1 = m->field_count_dont_copy_me__upb_internal_use_only;
  puVar2 = m->fields_dont_copy_me__upb_internal_use_only;
  puVar3 = *f;
  do {
    puVar5 = puVar3 + 1;
    if (puVar2 + uVar1 <= puVar5) goto LAB_001268a0;
    puVar4 = puVar3 + 1;
    puVar3 = puVar5;
  } while (puVar4->presence != (*f)->presence);
  *f = puVar5;
LAB_001268a0:
  return puVar5 < puVar2 + uVar1;
}

Assistant:

bool upb_MiniTable_NextOneofField(const upb_MiniTable* m,
                                  const upb_MiniTableField** f) {
  const upb_MiniTableField* ptr = *f;
  const upb_MiniTableField* end =
      &m->UPB_PRIVATE(fields)[m->UPB_PRIVATE(field_count)];
  while (++ptr < end) {
    if (ptr->presence == (*f)->presence) {
      *f = ptr;
      return true;
    }
  }
  return false;
}